

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

Symbol __thiscall
google::protobuf::DescriptorPool::CrossLinkOnDemandHelper
          (DescriptorPool *this,string *name,bool expecting_enum)

{
  pointer pcVar1;
  Tables *this_00;
  Symbol SVar2;
  string lookup_name;
  string local_58;
  long *local_38 [2];
  long local_28 [2];
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + name->_M_string_length);
  if ((local_58._M_string_length != 0) && (*local_58._M_dataplus._M_p == '.')) {
    std::__cxx11::string::substr((ulong)local_38,(ulong)&local_58);
    std::__cxx11::string::operator=((string *)&local_58,(string *)local_38);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
  }
  this_00 = (this->tables_).ptr_;
  if (this_00 != (Tables *)0x0) {
    SVar2 = Tables::FindByNameHelper(this_00,this,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    SVar2._4_4_ = 0;
    return SVar2;
  }
  __assert_fail("ptr_ != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                ,0x5f,
                "C *google::protobuf::internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->() const [C = google::protobuf::DescriptorPool::Tables]"
               );
}

Assistant:

Symbol DescriptorPool::CrossLinkOnDemandHelper(const string& name,
                                               bool expecting_enum) const {
  string lookup_name = name;
  if (!lookup_name.empty() && lookup_name[0] == '.') {
    lookup_name = lookup_name.substr(1);
  }
  Symbol result = tables_->FindByNameHelper(this, lookup_name);
  return result;
}